

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *OS,bool ShowColors,bool ShowKindLabel)

{
  int iVar1;
  bool bVar2;
  WithColor *pWVar3;
  ulong uVar4;
  size_type __n;
  size_type sVar5;
  const_reference pvVar6;
  char *pcVar7;
  char *__last;
  size_t length;
  undefined1 *puVar8;
  long lVar9;
  ulong uVar10;
  undefined1 DisableColors;
  ArrayRef<char> SourceLine;
  StringRef Prefix;
  StringRef Prefix_00;
  StringRef Prefix_01;
  StringRef Prefix_02;
  bool local_2d1;
  ulong local_1b0;
  size_t OutCol_1;
  size_t e_2;
  size_t i_1;
  char local_18d;
  uint local_18c;
  uint local_188;
  uint OutCol;
  uint e_1;
  uint i;
  WithColor S_1;
  ArrayRef<llvm::SMFixIt> local_150;
  undefined1 local_140 [8];
  string FixItInsertionLine;
  unsigned_long local_118;
  ulong local_110;
  value_type local_108;
  pair<unsigned_int,_unsigned_int> R;
  uint local_f8;
  uint e;
  uint r;
  string CaretLine;
  size_t NumColumns;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  char local_a1;
  WithColor local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  int local_4c;
  char local_46 [14];
  undefined1 local_38 [8];
  WithColor S;
  bool ShowKindLabel_local;
  bool ShowColors_local;
  raw_ostream *OS_local;
  char *ProgName_local;
  SMDiagnostic *this_local;
  
  DisableColors = 0;
  S._14_1_ = ShowKindLabel;
  S._15_1_ = ShowColors;
  OS_local = (raw_ostream *)ProgName;
  ProgName_local = (char *)this;
  WithColor::WithColor
            ((WithColor *)local_38,OS,SAVEDCOLOR,true,false,(bool)((ShowColors ^ 0xffU) & 1));
  if ((OS_local != (raw_ostream *)0x0) && (*(char *)&OS_local->_vptr_raw_ostream != '\0')) {
    pWVar3 = WithColor::operator<<((WithColor *)local_38,(char **)&OS_local);
    WithColor::operator<<(pWVar3,(char (*) [3])0x290727d);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar2 = std::operator==(&this->Filename,"-");
    if (bVar2) {
      WithColor::operator<<((WithColor *)local_38,(char (*) [8])"<stdin>");
    }
    else {
      WithColor::operator<<((WithColor *)local_38,&this->Filename);
    }
    if (this->LineNo != -1) {
      local_46[1] = 0x3a;
      pWVar3 = WithColor::operator<<((WithColor *)local_38,local_46 + 1);
      WithColor::operator<<(pWVar3,&this->LineNo);
      if (this->ColumnNo != -1) {
        local_46[0] = ':';
        pWVar3 = WithColor::operator<<((WithColor *)local_38,local_46);
        local_4c = this->ColumnNo + 1;
        WithColor::operator<<(pWVar3,&local_4c);
      }
    }
    WithColor::operator<<((WithColor *)local_38,(char (*) [3])0x290727d);
  }
  WithColor::~WithColor((WithColor *)local_38);
  if ((S._14_1_ & 1) != 0) {
    switch(this->Kind) {
    case DK_Error:
      StringRef::StringRef(&local_60,"");
      Prefix.Length._0_4_ = (S._15_1_ ^ 0xff) & 1;
      Prefix.Data = (char *)local_60.Length;
      Prefix.Length._4_4_ = 0;
      WithColor::error((WithColor *)OS,(raw_ostream *)local_60.Data,Prefix,(bool)DisableColors);
      break;
    case DK_Warning:
      StringRef::StringRef(&local_70,"");
      Prefix_00.Length._0_4_ = (S._15_1_ ^ 0xff) & 1;
      Prefix_00.Data = (char *)local_70.Length;
      Prefix_00.Length._4_4_ = 0;
      WithColor::warning((WithColor *)OS,(raw_ostream *)local_70.Data,Prefix_00,(bool)DisableColors)
      ;
      break;
    case DK_Remark:
      StringRef::StringRef(&local_90,"");
      Prefix_02.Length._0_4_ = (S._15_1_ ^ 0xff) & 1;
      Prefix_02.Data = (char *)local_90.Length;
      Prefix_02.Length._4_4_ = 0;
      WithColor::remark((WithColor *)OS,(raw_ostream *)local_90.Data,Prefix_02,(bool)DisableColors);
      break;
    case DK_Note:
      StringRef::StringRef(&local_80,"");
      Prefix_01.Length._0_4_ = (S._15_1_ ^ 0xff) & 1;
      Prefix_01.Data = (char *)local_80.Length;
      Prefix_01.Length._4_4_ = 0;
      WithColor::note((WithColor *)OS,(raw_ostream *)local_80.Data,Prefix_01,(bool)DisableColors);
    }
  }
  WithColor::WithColor(&local_a0,OS,SAVEDCOLOR,true,false,(bool)(~S._15_1_ & 1));
  pWVar3 = WithColor::operator<<(&local_a0,&this->Message);
  local_a1 = '\n';
  WithColor::operator<<(pWVar3,&local_a1);
  WithColor::~WithColor(&local_a0);
  if ((this->LineNo != -1) && (this->ColumnNo != -1)) {
    local_b0._M_current =
         (char *)find_if<std::__cxx11::string_const&,bool(*)(char)>(&this->LineContents,isNonASCII);
    local_b8._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_b0,&local_b8);
    if (bVar2) {
      StringRef::StringRef((StringRef *)&NumColumns,&this->LineContents);
      printSourceLine(OS,_NumColumns);
    }
    else {
      CaretLine.field_2._8_8_ = std::__cxx11::string::size();
      __n = CaretLine.field_2._8_8_ + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&r,__n,' ',(allocator<char> *)((long)&e + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 3));
      local_f8 = 0;
      sVar5 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::size(&this->Ranges);
      R.second = (uint)sVar5;
      for (; local_f8 != R.second; local_f8 = local_f8 + 1) {
        pvVar6 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->Ranges,(ulong)local_f8);
        local_108 = *pvVar6;
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&r);
        local_110 = (ulong)local_108 >> 0x20;
        local_118 = std::__cxx11::string::size();
        std::min<unsigned_long>(&local_110,&local_118);
        __last = (char *)std::__cxx11::string::operator[]((ulong)&r);
        FixItInsertionLine.field_2._M_local_buf[0xf] = '~';
        std::fill<char*,char>(pcVar7,__last,FixItInsertionLine.field_2._M_local_buf + 0xf);
      }
      std::__cxx11::string::string((string *)local_140);
      ArrayRef<llvm::SMFixIt>::ArrayRef<void>
                (&local_150,(SmallVectorTemplateCommon<llvm::SMFixIt,_void> *)&this->FixIts);
      pcVar7 = SMLoc::getPointer(&this->Loc);
      iVar1 = this->ColumnNo;
      length = std::__cxx11::string::size();
      SourceLine = makeArrayRef<char>(pcVar7 + -(long)iVar1,length);
      buildFixItLine((string *)&r,(string *)local_140,local_150,SourceLine);
      if ((ulong)CaretLine.field_2._8_8_ < (ulong)(uint)this->ColumnNo) {
        puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&r);
        *puVar8 = 0x5e;
      }
      else {
        puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&r);
        *puVar8 = 0x5e;
      }
      lVar9 = std::__cxx11::string::find_last_not_of((char)&r,0x20);
      std::__cxx11::string::erase((ulong)&r,lVar9 + 1);
      StringRef::StringRef((StringRef *)&S_1.DisableColors,&this->LineContents);
      printSourceLine(OS,stack0xfffffffffffffe90);
      WithColor::WithColor((WithColor *)&e_1,OS,GREEN,true,false,(bool)(~S._15_1_ & 1));
      OutCol = 0;
      local_188 = std::__cxx11::string::size();
      local_18c = 0;
      for (; OutCol != local_188; OutCol = OutCol + 1) {
        uVar4 = (ulong)OutCol;
        uVar10 = std::__cxx11::string::size();
        if ((uVar4 < uVar10) &&
           (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&this->LineContents),
           *pcVar7 == '\t')) {
          do {
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&r);
            WithColor::operator<<((WithColor *)&e_1,pcVar7);
            local_18c = local_18c + 1;
          } while ((local_18c & 7) != 0);
        }
        else {
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&r);
          WithColor::operator<<((WithColor *)&e_1,pcVar7);
          local_18c = local_18c + 1;
        }
      }
      local_18d = '\n';
      WithColor::operator<<((WithColor *)&e_1,&local_18d);
      WithColor::~WithColor((WithColor *)&e_1);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        e_2 = 0;
        uVar4 = std::__cxx11::string::size();
        local_1b0 = 0;
        for (; e_2 < uVar4; e_2 = e_2 + 1) {
          uVar10 = std::__cxx11::string::size();
          if ((e_2 < uVar10) &&
             (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&this->LineContents),
             *pcVar7 == '\t')) {
            do {
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_140);
              raw_ostream::operator<<(OS,*pcVar7);
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_140);
              if (*pcVar7 != ' ') {
                e_2 = e_2 + 1;
              }
              local_1b0 = local_1b0 + 1;
              local_2d1 = (local_1b0 & 7) != 0 && e_2 != uVar4;
            } while (local_2d1);
          }
          else {
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_140);
            raw_ostream::operator<<(OS,*pcVar7);
            local_1b0 = local_1b0 + 1;
          }
        }
        raw_ostream::operator<<(OS,'\n');
      }
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)&r);
    }
  }
  return;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &OS,
                         bool ShowColors, bool ShowKindLabel) const {
  {
    WithColor S(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors);

    if (ProgName && ProgName[0])
      S << ProgName << ": ";

    if (!Filename.empty()) {
      if (Filename == "-")
        S << "<stdin>";
      else
        S << Filename;

      if (LineNo != -1) {
        S << ':' << LineNo;
        if (ColumnNo != -1)
          S << ':' << (ColumnNo + 1);
      }
      S << ": ";
    }
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      WithColor::error(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Warning:
      WithColor::warning(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Note:
      WithColor::note(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Remark:
      WithColor::remark(OS, "", !ShowColors);
      break;
    }
  }

  WithColor(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors)
      << Message << '\n';

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(OS, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(OS, LineContents);

  {
    WithColor S(OS, raw_ostream::GREEN, true, false, !ShowColors);

    // Print out the caret line, matching tabs in the source line.
    for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
      if (i >= LineContents.size() || LineContents[i] != '\t') {
        S << CaretLine[i];
        ++OutCol;
        continue;
      }

      // Okay, we have a tab.  Insert the appropriate number of characters.
      do {
        S << CaretLine[i];
        ++OutCol;
      } while ((OutCol % TabStop) != 0);
    }
    S << '\n';
  }

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      OS << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      OS << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  OS << '\n';
}